

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

int Saig_ManCallSolver(Gia_ManBmc_t *p,int Lit)

{
  int local_1c;
  Gia_ManBmc_t *pGStack_18;
  int Lit_local;
  Gia_ManBmc_t *p_local;
  
  if (Lit == 0) {
    p_local._4_4_ = -1;
  }
  else if (Lit == 1) {
    p_local._4_4_ = 1;
  }
  else {
    local_1c = Lit;
    pGStack_18 = p;
    if (p->pSat2 == (satoko_t *)0x0) {
      if (p->pSat3 == (bmcg_sat_solver *)0x0) {
        p_local._4_4_ =
             sat_solver_solve(p->pSat,&local_1c,(lit *)&stack0xffffffffffffffe8,
                              (long)p->pPars->nConfLimit,0,0,0);
      }
      else {
        bmcg_sat_solver_set_conflict_budget(p->pSat3,p->pPars->nConfLimit);
        p_local._4_4_ = bmcg_sat_solver_solve(pGStack_18->pSat3,&local_1c,1);
      }
    }
    else {
      p_local._4_4_ = satoko_solve_assumptions_limit(p->pSat2,&local_1c,1,p->pPars->nConfLimit);
    }
  }
  return p_local._4_4_;
}

Assistant:

int Saig_ManCallSolver( Gia_ManBmc_t * p, int Lit )
{
    if ( Lit == 0 )
        return l_False;
    if ( Lit == 1 )
        return l_True;
    if ( p->pSat2 )
        return satoko_solve_assumptions_limit( p->pSat2, &Lit, 1, p->pPars->nConfLimit );
    else if ( p->pSat3 )
    {
        bmcg_sat_solver_set_conflict_budget( p->pSat3, p->pPars->nConfLimit );
        return bmcg_sat_solver_solve( p->pSat3, &Lit, 1 );
    }
    else
        return sat_solver_solve( p->pSat, &Lit, &Lit + 1, (ABC_INT64_T)p->pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
}